

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct32_high24_stage5_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  longlong lVar7;
  longlong lVar8;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  __m128i alVar24;
  undefined1 auVar25 [16];
  __m128i alVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i alVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  alVar24 = x[9];
  alVar26 = x[10];
  lVar7 = x[0xd][0];
  uVar1 = *(undefined2 *)((long)x[0xd] + 2);
  uVar2 = *(undefined2 *)((long)x[0xd] + 4);
  uVar3 = *(undefined2 *)((long)x[0xd] + 6);
  lVar8 = x[0xd][1];
  uVar4 = *(undefined2 *)((long)x[0xd] + 10);
  uVar5 = *(undefined2 *)((long)x[0xd] + 0xc);
  uVar6 = *(undefined2 *)((long)x[0xd] + 0xe);
  auVar21._0_12_ = alVar24._0_12_;
  auVar21._12_2_ = alVar24[0]._6_2_;
  auVar21._14_2_ = *(undefined2 *)((long)x[0xe] + 6);
  auVar20._12_4_ = auVar21._12_4_;
  auVar20._0_10_ = alVar24._0_10_;
  auVar20._10_2_ = *(undefined2 *)((long)x[0xe] + 4);
  auVar19._10_6_ = auVar20._10_6_;
  auVar19._0_8_ = alVar24[0];
  auVar19._8_2_ = alVar24[0]._4_2_;
  auVar18._8_8_ = auVar19._8_8_;
  auVar18._6_2_ = *(undefined2 *)((long)x[0xe] + 2);
  auVar18._4_2_ = alVar24[0]._2_2_;
  auVar18._0_2_ = (undefined2)alVar24[0];
  auVar18._2_2_ = (short)x[0xe][0];
  auVar10._2_2_ = (short)x[0xe][1];
  auVar10._0_2_ = (short)alVar24[1];
  auVar10._4_2_ = alVar24[1]._2_2_;
  auVar10._6_2_ = *(undefined2 *)((long)x[0xe] + 10);
  auVar10._8_2_ = alVar24[1]._4_2_;
  auVar10._10_2_ = *(undefined2 *)((long)x[0xe] + 0xc);
  auVar10._12_2_ = alVar24[1]._6_2_;
  auVar10._14_2_ = *(undefined2 *)((long)x[0xe] + 0xe);
  auVar9._8_4_ = 0x61ff138;
  auVar9._0_8_ = 0x61ff138061ff138;
  auVar9._12_4_ = 0x61ff138;
  auVar27 = pmaddwd(auVar18,auVar9);
  auVar30 = pmaddwd(auVar10,auVar9);
  auVar32._8_4_ = 0xec8061f;
  auVar32._0_8_ = 0xec8061f0ec8061f;
  auVar32._12_4_ = 0xec8061f;
  auVar22 = pmaddwd(auVar18,auVar32);
  auVar11 = pmaddwd(auVar10,auVar32);
  auVar28._0_4_ = auVar27._0_4_ + in_XMM0_Da >> 0xc;
  auVar28._4_4_ = auVar27._4_4_ + in_XMM0_Db >> 0xc;
  auVar28._8_4_ = auVar27._8_4_ + in_XMM0_Dc >> 0xc;
  auVar28._12_4_ = auVar27._12_4_ + in_XMM0_Dd >> 0xc;
  auVar31._0_4_ = auVar30._0_4_ + in_XMM0_Da >> 0xc;
  auVar31._4_4_ = auVar30._4_4_ + in_XMM0_Db >> 0xc;
  auVar31._8_4_ = auVar30._8_4_ + in_XMM0_Dc >> 0xc;
  auVar31._12_4_ = auVar30._12_4_ + in_XMM0_Dd >> 0xc;
  alVar29 = (__m128i)packssdw(auVar28,auVar31);
  auVar23._0_4_ = auVar22._0_4_ + in_XMM0_Da >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + in_XMM0_Db >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + in_XMM0_Dc >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + in_XMM0_Dd >> 0xc;
  auVar12._0_4_ = auVar11._0_4_ + in_XMM0_Da >> 0xc;
  auVar12._4_4_ = auVar11._4_4_ + in_XMM0_Db >> 0xc;
  auVar12._8_4_ = auVar11._8_4_ + in_XMM0_Dc >> 0xc;
  auVar12._12_4_ = auVar11._12_4_ + in_XMM0_Dd >> 0xc;
  alVar24 = (__m128i)packssdw(auVar23,auVar12);
  x[9] = alVar29;
  x[0xe] = alVar24;
  auVar16._0_12_ = alVar26._0_12_;
  auVar16._12_2_ = alVar26[0]._6_2_;
  auVar16._14_2_ = uVar3;
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = alVar26._0_10_;
  auVar15._10_2_ = uVar2;
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = alVar26[0];
  auVar14._8_2_ = alVar26[0]._4_2_;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._6_2_ = uVar1;
  auVar13._4_2_ = alVar26[0]._2_2_;
  auVar13._0_2_ = (undefined2)alVar26[0];
  auVar13._2_2_ = (short)lVar7;
  auVar11._2_2_ = (short)lVar8;
  auVar11._0_2_ = (short)alVar26[1];
  auVar11._4_2_ = alVar26[1]._2_2_;
  auVar11._6_2_ = uVar4;
  auVar11._8_2_ = alVar26[1]._4_2_;
  auVar11._10_2_ = uVar5;
  auVar11._12_2_ = alVar26[1]._6_2_;
  auVar11._14_2_ = uVar6;
  auVar27._8_4_ = 0xf138f9e1;
  auVar27._0_8_ = 0xf138f9e1f138f9e1;
  auVar27._12_4_ = 0xf138f9e1;
  auVar30 = pmaddwd(auVar13,auVar27);
  auVar22 = pmaddwd(auVar27,auVar11);
  auVar27 = pmaddwd(auVar13,auVar9);
  auVar11 = pmaddwd(auVar11,auVar9);
  auVar25._0_4_ = auVar30._0_4_ + in_XMM0_Da >> 0xc;
  auVar25._4_4_ = auVar30._4_4_ + in_XMM0_Db >> 0xc;
  auVar25._8_4_ = auVar30._8_4_ + in_XMM0_Dc >> 0xc;
  auVar25._12_4_ = auVar30._12_4_ + in_XMM0_Dd >> 0xc;
  auVar30._0_4_ = auVar22._0_4_ + in_XMM0_Da >> 0xc;
  auVar30._4_4_ = auVar22._4_4_ + in_XMM0_Db >> 0xc;
  auVar30._8_4_ = auVar22._8_4_ + in_XMM0_Dc >> 0xc;
  auVar30._12_4_ = auVar22._12_4_ + in_XMM0_Dd >> 0xc;
  alVar26 = (__m128i)packssdw(auVar25,auVar30);
  auVar17._0_4_ = auVar27._0_4_ + in_XMM0_Da >> 0xc;
  auVar17._4_4_ = auVar27._4_4_ + in_XMM0_Db >> 0xc;
  auVar17._8_4_ = auVar27._8_4_ + in_XMM0_Dc >> 0xc;
  auVar17._12_4_ = auVar27._12_4_ + in_XMM0_Dd >> 0xc;
  auVar22._0_4_ = auVar11._0_4_ + in_XMM0_Da >> 0xc;
  auVar22._4_4_ = auVar11._4_4_ + in_XMM0_Db >> 0xc;
  auVar22._8_4_ = auVar11._8_4_ + in_XMM0_Dc >> 0xc;
  auVar22._12_4_ = auVar11._12_4_ + in_XMM0_Dd >> 0xc;
  alVar24 = (__m128i)packssdw(auVar17,auVar22);
  x[10] = alVar26;
  x[0xd] = alVar24;
  alVar24 = x[0x10];
  alVar26 = (__m128i)paddsw((undefined1  [16])alVar24,(undefined1  [16])x[0x13]);
  x[0x10] = alVar26;
  alVar24 = (__m128i)psubsw((undefined1  [16])alVar24,(undefined1  [16])x[0x13]);
  x[0x13] = alVar24;
  alVar24 = x[0x11];
  alVar26 = (__m128i)paddsw((undefined1  [16])alVar24,(undefined1  [16])x[0x12]);
  x[0x11] = alVar26;
  alVar24 = (__m128i)psubsw((undefined1  [16])alVar24,(undefined1  [16])x[0x12]);
  x[0x12] = alVar24;
  alVar24 = x[0x14];
  alVar26 = (__m128i)psubsw((undefined1  [16])x[0x17],(undefined1  [16])alVar24);
  x[0x14] = alVar26;
  alVar24 = (__m128i)paddsw((undefined1  [16])x[0x17],(undefined1  [16])alVar24);
  x[0x17] = alVar24;
  alVar24 = x[0x15];
  alVar26 = (__m128i)psubsw((undefined1  [16])x[0x16],(undefined1  [16])alVar24);
  x[0x15] = alVar26;
  alVar24 = (__m128i)paddsw((undefined1  [16])x[0x16],(undefined1  [16])alVar24);
  x[0x16] = alVar24;
  alVar24 = x[0x18];
  alVar26 = (__m128i)paddsw((undefined1  [16])alVar24,(undefined1  [16])x[0x1b]);
  x[0x18] = alVar26;
  alVar24 = (__m128i)psubsw((undefined1  [16])alVar24,(undefined1  [16])x[0x1b]);
  x[0x1b] = alVar24;
  alVar24 = x[0x19];
  alVar26 = (__m128i)paddsw((undefined1  [16])alVar24,(undefined1  [16])x[0x1a]);
  x[0x19] = alVar26;
  alVar24 = (__m128i)psubsw((undefined1  [16])alVar24,(undefined1  [16])x[0x1a]);
  x[0x1a] = alVar24;
  alVar24 = x[0x1c];
  alVar26 = (__m128i)psubsw((undefined1  [16])x[0x1f],(undefined1  [16])alVar24);
  x[0x1c] = alVar26;
  alVar24 = (__m128i)paddsw((undefined1  [16])x[0x1f],(undefined1  [16])alVar24);
  x[0x1f] = alVar24;
  alVar24 = x[0x1d];
  alVar26 = (__m128i)psubsw((undefined1  [16])x[0x1e],(undefined1  [16])alVar24);
  x[0x1d] = alVar26;
  alVar24 = (__m128i)paddsw((undefined1  [16])x[0x1e],(undefined1  [16])alVar24);
  x[0x1e] = alVar24;
  return;
}

Assistant:

static inline void idct32_high24_stage5_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  btf_16_adds_subs_sse2(x[16], x[19]);
  btf_16_adds_subs_sse2(x[17], x[18]);
  btf_16_subs_adds_sse2(x[23], x[20]);
  btf_16_subs_adds_sse2(x[22], x[21]);
  btf_16_adds_subs_sse2(x[24], x[27]);
  btf_16_adds_subs_sse2(x[25], x[26]);
  btf_16_subs_adds_sse2(x[31], x[28]);
  btf_16_subs_adds_sse2(x[30], x[29]);
}